

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvtree.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  stream *Input;
  ebml_context *Context;
  ebml_element *Element;
  int Level;
  parsercontext p;
  tchar_t Path [1024];
  int local_564;
  parsercontext local_560;
  tchar_t local_418 [1024];
  
  if (argc - 4U < 0xfffffffe) {
LAB_001059e8:
    main_cold_2();
    iVar1 = 1;
  }
  else {
    if (argc == 3) {
      iVar1 = strcmp(argv[1],"--pos");
      if (iVar1 != 0) goto LAB_001059e8;
      ShowPos = 1;
    }
    ParserContext_Init(&local_560,(nodemeta *)0x0,(cc_memheap *)0x0,(cc_memheap *)0x0);
    MATROSKA_Init(&local_560);
    Node_FromStr(&local_560,local_418,0x400,argv[(ulong)(uint)argc - 1]);
    Input = StreamOpen(&local_560,local_418,1);
    if (Input == (stream *)0x0) {
      main_cold_1();
    }
    else {
      Context = MATROSKA_getContextStream();
      Element = EBML_ElementCreate(Input,Context,0,0x3f);
      if (Element != (ebml_element *)0x0) {
        local_564 = -1;
        EBML_ElementSetInfiniteSize(Element,1);
        OutputElement(Element,(ebml_parser_context *)0x0,Input,&local_564);
        NodeDelete((node *)Element);
      }
      StreamClose(Input);
    }
    ParserContext_Done(&local_560);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, const char *argv[])
{
    parsercontext p;
    struct stream *Input;
    tchar_t Path[MAXPATHFULL];

    if ((argc!=2 && argc!=3) || (argc==3 && strcmp(argv[1],"--pos")))
    {
        fprintf(stderr, "Usage: mkvtree --pos [matroska_file]\r\n");
		fprintf(stderr, "Options:\r\n");
		fprintf(stderr, "  --pos     output the position of elements\r\n");
        return 1;
    }

    if (argc==3)
        ShowPos = 1;

    // Core-C init phase
    ParserContext_Init(&p,NULL,NULL,NULL);
    // EBML & Matroska Init
    MATROSKA_Init(&p);

    // open the file to parse
    Node_FromStr(&p,Path,TSIZEOF(Path),argv[argc-1]);
    Input = StreamOpen(&p,Path,SFLAG_RDONLY/*|SFLAG_BUFFERED*/);
    if (Input == NULL)
        fprintf(stderr, "error: mkvtree cannot open file \"%s\"\r\n",argv[1]);
    else
    {
        OutputTree(Input);

        StreamClose(Input);
    }

    // Core-C ending
    ParserContext_Done(&p);

    return 0;
}